

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CMU462::Application::setGhosted(Application *this,bool isGhosted)

{
  bool bVar1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *this_00;
  reference ppSVar2;
  SceneObject *object;
  iterator __end1;
  iterator __begin1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range1;
  bool isGhosted_local;
  Application *this_local;
  
  this->isGhosted = isGhosted;
  this_00 = &this->scene->objects;
  __end1 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(this_00);
  object = (SceneObject *)
           std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::end(this_00);
  while( true ) {
    bVar1 = std::operator!=(&__end1,(_Self *)&object);
    if (!bVar1) break;
    ppSVar2 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end1);
    (*ppSVar2)->isGhosted = isGhosted;
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end1);
  }
  return;
}

Assistant:

void Application::setGhosted(bool isGhosted)
{
  this->isGhosted = isGhosted;
  for (auto object : scene->objects)
  {
    object->isGhosted = isGhosted;
  }
}